

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int fix_program(pcap_t *handle,sock_fprog *fcode,int is_mmapped)

{
  bpf_insn *p_00;
  u_int uVar1;
  void *pvVar2;
  ushort uVar3;
  int iVar4;
  size_t __size;
  sock_filter *__dest;
  int *piVar5;
  char *pcVar6;
  int len;
  bpf_insn *f;
  bpf_insn *p;
  int i;
  size_t prog_size;
  pcap_linux *handlep;
  int is_mmapped_local;
  sock_fprog *fcode_local;
  pcap_t *handle_local;
  
  pvVar2 = handle->priv;
  __size = (ulong)(handle->fcode).bf_len << 3;
  uVar1 = (handle->fcode).bf_len;
  __dest = (sock_filter *)malloc(__size);
  if (__dest == (sock_filter *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = pcap_strerror(*piVar5);
    snprintf(handle->errbuf,0x100,"malloc: %s",pcVar6);
    handle_local._4_4_ = -1;
  }
  else {
    memcpy(__dest,(handle->fcode).bf_insns,__size);
    fcode->len = (unsigned_short)uVar1;
    fcode->filter = __dest;
    for (p._4_4_ = 0; p._4_4_ < (int)uVar1; p._4_4_ = p._4_4_ + 1) {
      p_00 = (bpf_insn *)(__dest + p._4_4_);
      uVar3 = p_00->code & 7;
      if (uVar3 < 2) {
        uVar3 = p_00->code & 0xe0;
        if ((((uVar3 == 0x20) || (uVar3 == 0x40)) || (uVar3 == 0xa0)) &&
           ((*(int *)((long)pvVar2 + 0x3c) != 0 && (iVar4 = fix_offset(p_00), iVar4 < 0)))) {
          return 0;
        }
      }
      else if (((uVar3 == 6) && (is_mmapped == 0)) && (((p_00->code & 0xe0) == 0 && (p_00->k != 0)))
              ) {
        p_00->k = 0x40000;
      }
    }
    handle_local._4_4_ = 1;
  }
  return handle_local._4_4_;
}

Assistant:

static int
fix_program(pcap_t *handle, struct sock_fprog *fcode, int is_mmapped)
{
	struct pcap_linux *handlep = handle->priv;
	size_t prog_size;
	register int i;
	register struct bpf_insn *p;
	struct bpf_insn *f;
	int len;

	/*
	 * Make a copy of the filter, and modify that copy if
	 * necessary.
	 */
	prog_size = sizeof(*handle->fcode.bf_insns) * handle->fcode.bf_len;
	len = handle->fcode.bf_len;
	f = (struct bpf_insn *)malloc(prog_size);
	if (f == NULL) {
		pcap_snprintf(handle->errbuf, PCAP_ERRBUF_SIZE,
			 "malloc: %s", pcap_strerror(errno));
		return -1;
	}
	memcpy(f, handle->fcode.bf_insns, prog_size);
	fcode->len = len;
	fcode->filter = (struct sock_filter *) f;

	for (i = 0; i < len; ++i) {
		p = &f[i];
		/*
		 * What type of instruction is this?
		 */
		switch (BPF_CLASS(p->code)) {

		case BPF_RET:
			/*
			 * It's a return instruction; are we capturing
			 * in memory-mapped mode?
			 */
			if (!is_mmapped) {
				/*
				 * No; is the snapshot length a constant,
				 * rather than the contents of the
				 * accumulator?
				 */
				if (BPF_MODE(p->code) == BPF_K) {
					/*
					 * Yes - if the value to be returned,
					 * i.e. the snapshot length, is
					 * anything other than 0, make it
					 * MAXIMUM_SNAPLEN, so that the packet
					 * is truncated by "recvfrom()",
					 * not by the filter.
					 *
					 * XXX - there's nothing we can
					 * easily do if it's getting the
					 * value from the accumulator; we'd
					 * have to insert code to force
					 * non-zero values to be
					 * MAXIMUM_SNAPLEN.
					 */
					if (p->k != 0)
						p->k = MAXIMUM_SNAPLEN;
				}
			}
			break;

		case BPF_LD:
		case BPF_LDX:
			/*
			 * It's a load instruction; is it loading
			 * from the packet?
			 */
			switch (BPF_MODE(p->code)) {

			case BPF_ABS:
			case BPF_IND:
			case BPF_MSH:
				/*
				 * Yes; are we in cooked mode?
				 */
				if (handlep->cooked) {
					/*
					 * Yes, so we need to fix this
					 * instruction.
					 */
					if (fix_offset(p) < 0) {
						/*
						 * We failed to do so.
						 * Return 0, so our caller
						 * knows to punt to userland.
						 */
						return 0;
					}
				}
				break;
			}
			break;
		}
	}
	return 1;	/* we succeeded */
}